

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

bitcount_t uECC_vli_numBits(uECC_word_t *vli,wordcount_t max_words)

{
  int iVar1;
  short sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = (ulong)(byte)max_words;
  iVar1 = (uint)(byte)max_words << 0x18;
  do {
    iVar5 = iVar1;
    uVar3 = uVar4;
    uVar4 = uVar3 - 1;
    if ((char)uVar4 < '\0') break;
    iVar1 = iVar5 + -0x1000000;
  } while (vli[(uint)uVar4 & 0x7f] == 0);
  if (uVar3 == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (char)uVar3 * 0x40 + -0x40;
    for (uVar4 = vli[(long)(iVar5 >> 0x18) + -1]; uVar4 != 0; uVar4 = uVar4 >> 1) {
      sVar2 = sVar2 + 1;
    }
  }
  return sVar2;
}

Assistant:

uECC_VLI_API bitcount_t uECC_vli_numBits(const uECC_word_t *vli, const wordcount_t max_words) {
    uECC_word_t i;
    uECC_word_t digit;

    wordcount_t num_digits = vli_numDigits(vli, max_words);
    if (num_digits == 0) {
        return 0;
    }

    digit = vli[num_digits - 1];
    for (i = 0; digit; ++i) {
        digit >>= 1;
    }

    return (((bitcount_t)(num_digits - 1) << uECC_WORD_BITS_SHIFT) + i);
}